

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_a.h
# Opt level: O0

size_t arena_internal_get(arena_t *arena)

{
  arena_t *arena_local;
  size_t result;
  
  return (arena->stats).internal.repr;
}

Assistant:

static inline size_t
arena_internal_get(arena_t *arena) {
	return atomic_load_zu(&arena->stats.internal, ATOMIC_RELAXED);
}